

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priorbox.cpp
# Opt level: O1

int __thiscall
ncnn::PriorBox::forward
          (PriorBox *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float fVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  pointer pMVar7;
  Mat *pMVar8;
  void *pvVar9;
  void *pvVar10;
  void *pvVar11;
  void *pvVar12;
  int iVar13;
  ulong uVar14;
  float *pfVar15;
  long lVar16;
  float *pfVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int k;
  ulong uVar21;
  ulong uVar22;
  uint uVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  uint uVar32;
  undefined1 auVar33 [16];
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  
  pMVar7 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  iVar2 = pMVar7->w;
  uVar3 = pMVar7->h;
  iVar19 = this->image_width;
  iVar20 = this->image_height;
  if (((iVar20 == -0xe9 && iVar19 == -0xe9) &&
       (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_finish - (long)pMVar7 == 0x40) &&
     (((this->max_sizes).data == (void *)0x0 ||
      ((long)(this->max_sizes).c * (this->max_sizes).cstep == 0)))) {
    fVar31 = this->step_width;
    fVar1 = this->step_height;
    uVar4 = (this->min_sizes).w;
    uVar6 = (this->aspect_ratios).w;
    iVar19 = uVar4 + uVar6 + -1;
    pMVar8 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    Mat::create(pMVar8,iVar2 * uVar3 * iVar19 * 4,4,opt->blob_allocator);
    pvVar9 = pMVar8->data;
    iVar13 = -100;
    if ((pvVar9 != (void *)0x0) && ((long)pMVar8->c * pMVar8->cstep != 0)) {
      if (0 < (int)uVar3) {
        fVar25 = 1.0 / (float)iVar2;
        uVar23 = -(uint)(fVar31 == -233.0);
        fVar31 = (float)(~uVar23 & (uint)fVar31 | uVar23 & (uint)fVar25);
        uVar23 = -(uint)(fVar1 == -233.0);
        fVar26 = (float)(int)uVar3 * 0.5;
        pfVar15 = (float *)(this->min_sizes).data;
        uVar14 = 0;
        do {
          if (0 < iVar2) {
            fVar27 = ((float)(int)uVar14 + this->offset) *
                     (float)(~uVar23 & (uint)fVar1 | (uint)(1.0 / (float)(int)uVar3) & uVar23);
            fVar28 = this->offset * fVar31;
            pfVar17 = (float *)((long)pvVar9 + (long)(iVar19 * iVar2 * 4 * (int)uVar14) * 4);
            pvVar10 = (this->min_sizes).data;
            pvVar11 = (this->aspect_ratios).data;
            iVar20 = 0;
            do {
              if (0 < (int)uVar4) {
                uVar21 = 0;
                do {
                  fVar29 = *(float *)((long)pvVar10 + uVar21 * 4);
                  fVar30 = fVar26 * fVar29 * fVar25;
                  fVar29 = fVar29 * 0.5;
                  *pfVar17 = fVar28 - fVar30;
                  pfVar17[1] = fVar27 - fVar29;
                  pfVar17[2] = fVar28 + fVar30;
                  pfVar17[3] = fVar27 + fVar29;
                  pfVar17 = pfVar17 + 4;
                  uVar21 = uVar21 + 1;
                } while (uVar4 != uVar21);
              }
              if (1 < (int)uVar6) {
                fVar29 = *pfVar15;
                uVar21 = 1;
                do {
                  fVar30 = *(float *)((long)pvVar11 + uVar21 * 4);
                  auVar33 = rsqrtss(ZEXT816(0),ZEXT416((uint)fVar30));
                  fVar34 = auVar33._0_4_;
                  fVar24 = fVar30 * fVar34 * fVar34 + -3.0;
                  fVar30 = (float)(~-(uint)(ABS(fVar30) < 1.1754944e-38) &
                                  (uint)(fVar30 * fVar34 * -0.5 * fVar24)) *
                           fVar26 * fVar29 * fVar25;
                  fVar24 = fVar34 * -0.5 * fVar29 * 0.5 * fVar24;
                  *pfVar17 = fVar28 - fVar30;
                  pfVar17[1] = fVar27 - fVar24;
                  pfVar17[2] = fVar28 + fVar30;
                  pfVar17[3] = fVar27 + fVar24;
                  pfVar17 = pfVar17 + 4;
                  uVar21 = uVar21 + 1;
                } while (uVar6 != uVar21);
              }
              fVar28 = fVar28 + fVar31;
              iVar20 = iVar20 + 1;
            } while (iVar20 != iVar2);
          }
          uVar14 = uVar14 + 1;
        } while (uVar14 != uVar3);
      }
      iVar13 = 0;
      if ((this->clip != 0) && (iVar2 = pMVar8->w, 0 < (long)iVar2)) {
        iVar13 = 0;
        lVar16 = 0;
        do {
          fVar31 = *(float *)((long)pvVar9 + lVar16 * 4);
          if (fVar31 <= 0.0) {
            fVar31 = 0.0;
          }
          if (1.0 <= fVar31) {
            fVar31 = 1.0;
          }
          *(float *)((long)pvVar9 + lVar16 * 4) = fVar31;
          lVar16 = lVar16 + 1;
        } while (iVar2 != lVar16);
      }
    }
  }
  else {
    if (iVar19 == -0xe9) {
      iVar19 = pMVar7[1].w;
    }
    if (iVar20 == -0xe9) {
      iVar20 = pMVar7[1].h;
    }
    fVar31 = this->step_width;
    fVar1 = this->step_height;
    uVar4 = (this->min_sizes).w;
    iVar5 = (this->max_sizes).w;
    uVar6 = (this->aspect_ratios).w;
    iVar18 = this->flip;
    if (this->flip != 0) {
      iVar18 = uVar6 * uVar4;
    }
    iVar18 = uVar6 * uVar4 + iVar5 + uVar4 + iVar18;
    pMVar8 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    Mat::create(pMVar8,iVar2 * uVar3 * iVar18 * 4,2,4,opt->blob_allocator);
    pvVar9 = pMVar8->data;
    iVar13 = -100;
    if ((pvVar9 != (void *)0x0) && ((long)pMVar8->c * pMVar8->cstep != 0)) {
      if (0 < (int)uVar3) {
        fVar25 = (float)iVar19;
        fVar27 = (float)iVar20;
        auVar33._4_4_ = fVar27;
        auVar33._0_4_ = fVar25;
        auVar33._12_4_ = fVar27;
        auVar33._8_4_ = fVar25;
        uVar23 = -(uint)(fVar31 == -233.0);
        fVar31 = (float)(~uVar23 & (uint)fVar31 | (uint)(fVar25 / (float)iVar2) & uVar23);
        uVar23 = -(uint)(fVar1 == -233.0);
        uVar32 = (uint)(fVar27 / (float)(int)uVar3) & uVar23;
        auVar33 = rcpps(ZEXT416(uVar32),auVar33);
        fVar26 = auVar33._0_4_;
        fVar28 = auVar33._4_4_;
        fVar29 = auVar33._8_4_;
        fVar30 = auVar33._12_4_;
        fVar26 = (1.0 - fVar25 * fVar26) * fVar26 + fVar26;
        fVar28 = (1.0 - fVar27 * fVar28) * fVar28 + fVar28;
        fVar29 = (1.0 - fVar25 * fVar29) * fVar29 + fVar29;
        fVar30 = (1.0 - fVar27 * fVar30) * fVar30 + fVar30;
        uVar14 = 0;
        do {
          if (0 < iVar2) {
            fVar25 = ((float)(int)uVar14 + this->offset) * (float)(~uVar23 & (uint)fVar1 | uVar32);
            fVar27 = this->offset * fVar31;
            pfVar15 = (float *)((long)pvVar9 + (long)(iVar18 * iVar2 * 4 * (int)uVar14) * 4);
            pvVar10 = (this->min_sizes).data;
            iVar19 = 0;
            do {
              if (0 < (int)uVar4) {
                pvVar11 = (this->max_sizes).data;
                pvVar12 = (this->aspect_ratios).data;
                iVar20 = this->flip;
                uVar21 = 0;
                do {
                  fVar24 = *(float *)((long)pvVar10 + uVar21 * 4);
                  fVar34 = fVar24 * 0.5;
                  *pfVar15 = (fVar27 - fVar34) * fVar26;
                  pfVar15[1] = (fVar25 - fVar34) * fVar28;
                  pfVar15[2] = (fVar34 + fVar27) * fVar29;
                  pfVar15[3] = (fVar34 + fVar25) * fVar30;
                  if (iVar5 < 1) {
                    pfVar15 = pfVar15 + 4;
                  }
                  else {
                    fVar35 = SQRT(*(float *)((long)pvVar11 + uVar21 * 4) * fVar24) * 0.5;
                    pfVar15[4] = (fVar27 - fVar35) * fVar26;
                    pfVar15[5] = (fVar25 - fVar35) * fVar28;
                    pfVar15[6] = (fVar35 + fVar27) * fVar29;
                    pfVar15[7] = (fVar35 + fVar25) * fVar30;
                    pfVar15 = pfVar15 + 8;
                  }
                  if (0 < (int)uVar6) {
                    uVar22 = 0;
                    do {
                      fVar35 = *(float *)((long)pvVar12 + uVar22 * 4);
                      auVar33 = rsqrtss(ZEXT816(0),ZEXT416((uint)fVar35));
                      fVar37 = auVar33._0_4_;
                      fVar36 = fVar35 * fVar37 * fVar37 + -3.0;
                      fVar35 = (float)(~-(uint)(ABS(fVar35) < 1.1754944e-38) &
                                      (uint)(fVar35 * fVar37 * -0.5 * fVar36)) * fVar24 * 0.5;
                      fVar36 = fVar37 * -0.5 * fVar34 * fVar36;
                      *pfVar15 = (fVar27 - fVar35) * fVar26;
                      pfVar15[1] = (fVar25 - fVar36) * fVar28;
                      pfVar15[2] = (fVar27 + fVar35) * fVar29;
                      pfVar15[3] = (fVar25 + fVar36) * fVar30;
                      if (iVar20 == 0) {
                        pfVar15 = pfVar15 + 4;
                      }
                      else {
                        pfVar15[4] = (fVar27 - fVar36) * fVar26;
                        pfVar15[5] = (fVar25 - fVar35) * fVar28;
                        pfVar15[6] = (fVar27 + fVar36) * fVar29;
                        pfVar15[7] = (fVar25 + fVar35) * fVar30;
                        pfVar15 = pfVar15 + 8;
                      }
                      uVar22 = uVar22 + 1;
                    } while (uVar6 != uVar22);
                  }
                  uVar21 = uVar21 + 1;
                } while (uVar21 != uVar4);
              }
              fVar27 = fVar27 + fVar31;
              iVar19 = iVar19 + 1;
            } while (iVar19 != iVar2);
          }
          uVar14 = uVar14 + 1;
        } while (uVar14 != uVar3);
      }
      if ((this->clip != 0) && (iVar2 = pMVar8->w, 0 < (long)iVar2)) {
        lVar16 = 0;
        do {
          fVar31 = *(float *)((long)pvVar9 + lVar16 * 4);
          if (fVar31 <= 0.0) {
            fVar31 = 0.0;
          }
          if (1.0 <= fVar31) {
            fVar31 = 1.0;
          }
          *(float *)((long)pvVar9 + lVar16 * 4) = fVar31;
          lVar16 = lVar16 + 1;
        } while (iVar2 != lVar16);
      }
      iVar2 = pMVar8->w;
      lVar16 = (long)iVar2;
      iVar19 = iVar2 + 3;
      if (-1 < lVar16) {
        iVar19 = iVar2;
      }
      iVar13 = 0;
      if (3 < lVar16) {
        iVar19 = iVar19 >> 2;
        pfVar15 = (float *)((long)pvVar9 + lVar16 * pMVar8->elemsize);
        do {
          *pfVar15 = this->variances[0];
          pfVar15[1] = this->variances[1];
          pfVar15[2] = this->variances[2];
          pfVar15[3] = this->variances[3];
          pfVar15 = pfVar15 + 4;
          iVar19 = iVar19 + -1;
        } while (iVar19 != 0);
      }
    }
  }
  return iVar13;
}

Assistant:

int PriorBox::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    int w = bottom_blobs[0].w;
    int h = bottom_blobs[0].h;

    if (bottom_blobs.size() == 1 && image_width == -233 && image_height == -233 && max_sizes.empty())
    {
        // mxnet style _contrib_MultiBoxPrior
        float step_w = step_width;
        float step_h = step_height;
        if (step_w == -233)
            step_w = 1.f / (float)w;
        if (step_h == -233)
            step_h = 1.f / (float)h;

        int num_sizes = min_sizes.w;
        int num_ratios = aspect_ratios.w;

        int num_prior = num_sizes - 1 + num_ratios;

        Mat& top_blob = top_blobs[0];
        top_blob.create(4 * w * h * num_prior, 4u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* box = (float*)top_blob + i * w * num_prior * 4;

            float center_x = offset * step_w;
            float center_y = offset * step_h + i * step_h;

            for (int j = 0; j < w; j++)
            {
                // ratio = 1, various sizes
                for (int k = 0; k < num_sizes; k++)
                {
                    float size = min_sizes[k];
                    float cw = size * h / w / 2;
                    float ch = size / 2;

                    box[0] = center_x - cw;
                    box[1] = center_y - ch;
                    box[2] = center_x + cw;
                    box[3] = center_y + ch;
                    box += 4;
                }

                // various ratios, size = min_size = size[0]
                float size = min_sizes[0];
                for (int p = 1; p < num_ratios; p++)
                {
                    float ratio = sqrt(aspect_ratios[p]);
                    float cw = size * h / w * ratio / 2;
                    float ch = size / ratio / 2;

                    box[0] = center_x - cw;
                    box[1] = center_y - ch;
                    box[2] = center_x + cw;
                    box[3] = center_y + ch;
                    box += 4;
                }

                center_x += step_w;
            }
        }

        if (clip)
        {
            float* box = top_blob;
            for (int i = 0; i < top_blob.w; i++)
            {
                box[i] = std::min(std::max(box[i], 0.f), 1.f);
            }
        }

        return 0;
    }

    int image_w = image_width;
    int image_h = image_height;
    if (image_w == -233)
        image_w = bottom_blobs[1].w;
    if (image_h == -233)
        image_h = bottom_blobs[1].h;

    float step_w = step_width;
    float step_h = step_height;
    if (step_w == -233)
        step_w = (float)image_w / w;
    if (step_h == -233)
        step_h = (float)image_h / h;

    int num_min_size = min_sizes.w;
    int num_max_size = max_sizes.w;
    int num_aspect_ratio = aspect_ratios.w;

    int num_prior = num_min_size * num_aspect_ratio + num_min_size + num_max_size;
    if (flip)
        num_prior += num_min_size * num_aspect_ratio;

    Mat& top_blob = top_blobs[0];
    top_blob.create(4 * w * h * num_prior, 2, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < h; i++)
    {
        float* box = (float*)top_blob + i * w * num_prior * 4;

        float center_x = offset * step_w;
        float center_y = offset * step_h + i * step_h;

        for (int j = 0; j < w; j++)
        {
            float box_w;
            float box_h;

            for (int k = 0; k < num_min_size; k++)
            {
                float min_size = min_sizes[k];

                // min size box
                box_w = box_h = min_size;

                box[0] = (center_x - box_w * 0.5f) / image_w;
                box[1] = (center_y - box_h * 0.5f) / image_h;
                box[2] = (center_x + box_w * 0.5f) / image_w;
                box[3] = (center_y + box_h * 0.5f) / image_h;

                box += 4;

                if (num_max_size > 0)
                {
                    float max_size = max_sizes[k];

                    // max size box
                    box_w = box_h = sqrt(min_size * max_size);

                    box[0] = (center_x - box_w * 0.5f) / image_w;
                    box[1] = (center_y - box_h * 0.5f) / image_h;
                    box[2] = (center_x + box_w * 0.5f) / image_w;
                    box[3] = (center_y + box_h * 0.5f) / image_h;

                    box += 4;
                }

                // all aspect_ratios
                for (int p = 0; p < num_aspect_ratio; p++)
                {
                    float ar = aspect_ratios[p];

                    box_w = min_size * sqrt(ar);
                    box_h = min_size / sqrt(ar);

                    box[0] = (center_x - box_w * 0.5f) / image_w;
                    box[1] = (center_y - box_h * 0.5f) / image_h;
                    box[2] = (center_x + box_w * 0.5f) / image_w;
                    box[3] = (center_y + box_h * 0.5f) / image_h;

                    box += 4;

                    if (flip)
                    {
                        box[0] = (center_x - box_h * 0.5f) / image_w;
                        box[1] = (center_y - box_w * 0.5f) / image_h;
                        box[2] = (center_x + box_h * 0.5f) / image_w;
                        box[3] = (center_y + box_w * 0.5f) / image_h;

                        box += 4;
                    }
                }
            }

            center_x += step_w;
        }
    }

    if (clip)
    {
        float* box = top_blob;
        for (int i = 0; i < top_blob.w; i++)
        {
            box[i] = std::min(std::max(box[i], 0.f), 1.f);
        }
    }

    // set variance
    float* var = top_blob.row(1);
    for (int i = 0; i < top_blob.w / 4; i++)
    {
        var[0] = variances[0];
        var[1] = variances[1];
        var[2] = variances[2];
        var[3] = variances[3];

        var += 4;
    }

    return 0;
}